

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O3

uint8_t * push_insns(VARR_uint8_t *insn_varr,uint8_t *pat,size_t pat_len)

{
  uint8_t uVar1;
  VARR_uint8_t *__ptr;
  byte *pbVar2;
  int iVar3;
  ulong in_RCX;
  uint extraout_EDX;
  size_t sVar4;
  undefined4 uVar5;
  uint8_t *puVar6;
  VARR_uint8_t *pVVar7;
  uint8_t *__size;
  size_t sVar8;
  
  iVar3 = (int)in_RCX;
  if (pat_len == 0) {
    if (insn_varr == (VARR_uint8_t *)0x0) {
LAB_0013f423:
      uVar5 = SUB84(pat,0);
      push_insns_cold_2();
      puVar6 = gen_mov::ld_gp_reg;
      if (iVar3 == 0) {
        puVar6 = gen_mov::st_gp_reg;
      }
      pbVar2 = push_insns(insn_varr,puVar6,7);
      *(undefined4 *)(pbVar2 + 3) = uVar5;
      if (0xf < extraout_EDX) {
        __assert_fail("reg <= 15",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-x86_64.c"
                      ,0x103,"void gen_mov(VARR_uint8_t *, uint32_t, uint32_t, int)");
      }
      *pbVar2 = *pbVar2 | (byte)extraout_EDX >> 1 & 4;
      pbVar2[2] = pbVar2[2] | ((byte)extraout_EDX & 7) << 3;
      return pbVar2;
    }
  }
  else {
    sVar8 = 0;
    puVar6 = pat;
    pVVar7 = insn_varr;
    do {
      iVar3 = (int)in_RCX;
      __ptr = (VARR_uint8_t *)insn_varr->varr;
      if (__ptr == (VARR_uint8_t *)0x0) {
        push_insns_cold_1();
        pat = puVar6;
        insn_varr = pVVar7;
        goto LAB_0013f423;
      }
      sVar4 = insn_varr->els_num;
      uVar1 = pat[sVar8];
      in_RCX = sVar4 + 1;
      if (insn_varr->size < in_RCX) {
        __size = (uint8_t *)((in_RCX >> 1) + in_RCX);
        puVar6 = __size;
        pVVar7 = __ptr;
        __ptr = (VARR_uint8_t *)realloc(__ptr,(size_t)__size);
        insn_varr->varr = (uint8_t *)__ptr;
        insn_varr->size = (size_t)__size;
        sVar4 = insn_varr->els_num;
        in_RCX = sVar4 + 1;
      }
      sVar8 = sVar8 + 1;
      insn_varr->els_num = in_RCX;
      *(uint8_t *)((long)&__ptr->els_num + sVar4) = uVar1;
    } while (pat_len != sVar8);
  }
  return insn_varr->varr + (insn_varr->els_num - pat_len);
}

Assistant:

static uint8_t *push_insns (VARR (uint8_t) * insn_varr, const uint8_t *pat, size_t pat_len) {
  for (size_t i = 0; i < pat_len; i++) VARR_PUSH (uint8_t, insn_varr, pat[i]);
  return VARR_ADDR (uint8_t, insn_varr) + VARR_LENGTH (uint8_t, insn_varr) - pat_len;
}